

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O2

void __thiscall TextureImage::Texture::Texture(Texture *this)

{
  this->_vptr_Texture = (_func_int **)&PTR__Texture_002444a0;
  this->available = false;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this->width = 0;
  this->height = 0;
  this->tex = 0;
  return;
}

Assistant:

Texture()
                : available(false), name(), filename(), width(0), height(0), tex(0) {}